

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
          *fadexpr)

{
  double *pdVar1;
  bool bVar2;
  uint ssize;
  ulong uVar3;
  int i;
  ulong uVar4;
  value_type vVar5;
  
  ssize = FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
          ::size(&fadexpr->fadexpr_);
  if (ssize != (this->dx_).num_elts) {
    Vector<double>::resize(&this->dx_,ssize);
  }
  if (ssize != 0) {
    pdVar1 = (this->dx_).ptr_to_data;
    bVar2 = FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
            ::hasFastAccess(&fadexpr->fadexpr_);
    uVar3 = 0;
    if (0 < (int)ssize) {
      uVar3 = (ulong)ssize;
    }
    uVar4 = 0;
    if (bVar2) {
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        vVar5 = FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
                ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar4);
        pdVar1[uVar4] = vVar5;
      }
    }
    else {
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        vVar5 = FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
                ::dx(&fadexpr->fadexpr_,(int)uVar4);
        pdVar1[uVar4] = vVar5;
      }
    }
  }
  vVar5 = FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
          ::val(&fadexpr->fadexpr_);
  this->val_ = vVar5;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}